

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  
  for (sVar3 = 0;
      ((cVar4 = first[sVar3], cVar4 != '\0' && (cVar1 = second[sVar3], cVar1 != '\0')) &&
      (max != sVar3)); sVar3 = sVar3 + 1) {
    cVar6 = cVar4 + -0x20;
    if (0x19 < (byte)(cVar4 + 0x9fU)) {
      cVar6 = cVar4;
    }
    cVar5 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar5 = cVar1;
    }
    if (cVar6 != cVar5) goto LAB_00127e45;
  }
  if (max == sVar3) {
    uVar2 = 1;
  }
  else {
LAB_00127e45:
    if ((byte)(cVar4 + 0x9fU) < 0x1a) {
      cVar4 = cVar4 + -0x20;
    }
    cVar1 = second[sVar3];
    cVar6 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar6 = cVar1;
    }
    uVar2 = (uint)(cVar4 == cVar6);
  }
  return uVar2;
}

Assistant:

int Curl_strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}